

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawInventoryBar::Draw
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  Styles SVar1;
  APlayerPawn *pAVar2;
  CommandDrawNumber *pCVar3;
  uint uVar4;
  int iVar5;
  AInventory *pAVar6;
  FImageCollection *this_00;
  FTexture *pFVar7;
  AInventory *pAVar8;
  SBarInfoCoordinate y;
  int iVar9;
  ulong uVar10;
  SBarInfoCoordinate x;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  SBarInfoCoordinate y_00;
  int iVar14;
  SBarInfoCoordinate x_00;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  double Alpha;
  double Alpha_00;
  
  iVar5 = GetCounterSpacing(this,statusBar);
  Alpha = block->currentAlpha;
  if (this->translucent != false) {
    Alpha = Alpha * 0.59375;
  }
  pAVar6 = DBaseStatusBar::ValidateInvFirst(&statusBar->super_DBaseStatusBar,this->size);
  (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar6;
  pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
  pAVar6 = (pAVar2->InvFirst).field_0.p;
  if (pAVar6 != (AInventory *)0x0) {
    if (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0)
    goto LAB_005fd1a7;
    (pAVar2->InvFirst).field_0.p = (AInventory *)0x0;
  }
  if (this->alwaysShow != true) {
    return;
  }
LAB_005fd1a7:
  pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
  pAVar6 = (pAVar2->InvFirst).field_0.p;
  if ((pAVar6 != (AInventory *)0x0) &&
     (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (pAVar2->InvFirst).field_0.p = (AInventory *)0x0;
    pAVar6 = (AInventory *)0x0;
  }
  uVar12 = 0;
  bVar16 = pAVar6 == (AInventory *)0x0;
  if ((!bVar16) && (this->size != 0)) {
    this_00 = &statusBar->Images;
    iVar9 = 0;
    uVar12 = 0;
    do {
      bVar16 = this->vertical != false;
      iVar14 = iVar9;
      if (bVar16) {
        iVar14 = 0;
      }
      iVar13 = 0;
      if (bVar16) {
        iVar13 = iVar9;
      }
      x_00 = (SBarInfoCoordinate)(iVar14 + (int)this->x);
      y_00 = (SBarInfoCoordinate)(iVar13 + (int)this->y);
      if (this->noArtibox == false) {
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,x_00,y_00,block->xOffset,block->yOffset,Alpha,
                   block->fullScreenOffsets,false,false,0,false,-1);
      }
      SVar1 = this->style;
      if (SVar1 != STYLE_Strife) {
        uVar10 = (ulong)(pAVar6->Icon).texnum;
        if (uVar10 < TexMan.Textures.Count) {
          pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[uVar10]].Texture;
        }
        else {
          pFVar7 = (FTexture *)0x0;
        }
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,
                   (SBarInfoCoordinate)((int)x_00 + (uint)(SVar1 != STYLE_HexenStrict) * 4 + -4),
                   (SBarInfoCoordinate)((int)y_00 + -2 + (uint)(SVar1 != STYLE_HexenStrict) * 2),
                   block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets,false,
                   pAVar6->Amount < 1,0,false,-1);
      }
      pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
      pAVar8 = (pAVar2->InvSel).field_0.p;
      if ((pAVar8 != (AInventory *)0x0) &&
         (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar2->InvSel).field_0.p = (AInventory *)0x0;
        pAVar8 = (AInventory *)0x0;
      }
      if (pAVar6 != pAVar8) goto LAB_005fd492;
      switch(this->style) {
      case STYLE_Heretic:
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset + 1);
        y = (SBarInfoCoordinate)((int)y_00 + 0x3a);
        break;
      case STYLE_Hexen:
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset + 1);
        y = (SBarInfoCoordinate)((int)y_00 + -2);
        break;
      case STYLE_HexenStrict:
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset + 1);
        x = (SBarInfoCoordinate)((int)x_00 + -2);
        y = (SBarInfoCoordinate)((int)y_00 + -2);
        goto LAB_005fd403;
      case STYLE_Strife:
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset + 2);
        x = (SBarInfoCoordinate)((int)x_00 + -0xc);
        y = (SBarInfoCoordinate)((int)y_00 + -4);
LAB_005fd403:
        iVar14 = block->xOffset;
        iVar13 = block->yOffset;
        Alpha_00 = block->currentAlpha;
        bVar16 = block->fullScreenOffsets;
        goto LAB_005fd465;
      default:
        pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset + 1);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,x_00,y_00,block->xOffset,block->yOffset,block->currentAlpha,
                   block->fullScreenOffsets,false,false,0,false,-1);
        goto LAB_005fd492;
      }
      iVar14 = block->xOffset;
      iVar13 = block->yOffset;
      Alpha_00 = block->currentAlpha;
      bVar16 = block->fullScreenOffsets;
      x = x_00;
LAB_005fd465:
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,x,y,iVar14,iVar13,Alpha_00,bVar16,false,false,0,false,-1);
LAB_005fd492:
      if (this->style == STYLE_Strife) {
        uVar10 = (ulong)(pAVar6->Icon).texnum;
        if (uVar10 < TexMan.Textures.Count) {
          pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[uVar10]].Texture;
        }
        else {
          pFVar7 = (FTexture *)0x0;
        }
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar7,x_00,y_00,block->xOffset,block->yOffset,block->currentAlpha,
                   block->fullScreenOffsets,false,pAVar6->Amount < 1,0,false,-1);
      }
      if ((this->counters != (CommandDrawNumber **)0x0) &&
         ((this->alwaysShowCounter != false || (pAVar6->Amount != 1)))) {
        pCVar3 = this->counters[uVar12];
        (pCVar3->super_CommandDrawString).valueArgument = pAVar6->Amount;
        (*(pCVar3->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand[2])
                  (pCVar3,block,statusBar);
      }
      pAVar6 = AInventory::NextInv(pAVar6);
      uVar12 = uVar12 + 1;
      bVar16 = pAVar6 == (AInventory *)0x0;
    } while ((!bVar16) && (iVar9 = iVar9 + iVar5 * 2, uVar12 < this->size));
  }
  if ((uint)uVar12 < this->size) {
    iVar9 = iVar5 * (uint)uVar12 * 2;
    do {
      if (this->noArtibox != false) break;
      pFVar7 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset);
      bVar17 = this->vertical != false;
      iVar14 = iVar9;
      if (bVar17) {
        iVar14 = 0;
      }
      iVar13 = 0;
      if (bVar17) {
        iVar13 = iVar9;
      }
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,(SBarInfoCoordinate)(iVar14 + (int)this->x),
                 (SBarInfoCoordinate)(iVar13 + (int)this->y),block->xOffset,block->yOffset,Alpha,
                 block->fullScreenOffsets,false,false,0,false,-1);
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      iVar9 = iVar9 + iVar5 * 2;
    } while (uVar11 < this->size);
  }
  if (this->noArrows == false) {
    pAVar8 = AActor::FirstInv(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
    pAVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar6 = (pAVar2->InvFirst).field_0.p;
    if ((pAVar6 != (AInventory *)0x0) &&
       (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar2->InvFirst).field_0.p = (AInventory *)0x0;
      pAVar6 = (AInventory *)0x0;
    }
    if (pAVar8 != pAVar6) {
      SVar1 = this->style;
      uVar11 = 0xe;
      if (SVar1 != STYLE_Strife) {
        uVar11 = (uint)(SVar1 == STYLE_HexenStrict) * 2 | 0xfffffff4;
      }
      uVar15 = -(uint)(SVar1 == STYLE_HexenStrict);
      pFVar7 = FImageCollection::operator[]
                         (&statusBar->Images,
                          (statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 4);
      uVar4 = uVar15;
      if (this->vertical != false) {
        uVar4 = uVar11;
        uVar11 = uVar15;
      }
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,(SBarInfoCoordinate)(uVar11 * 2 + (int)this->x),
                 (SBarInfoCoordinate)(uVar4 * 2 + (int)this->y),block->xOffset,block->yOffset,
                 block->currentAlpha,block->fullScreenOffsets,false,false,0,false,-1);
    }
  }
  if (!bVar16 && this->noArrows == false) {
    SVar1 = this->style;
    uVar11 = this->size;
    if (SVar1 == STYLE_HexenStrict) {
      iVar5 = uVar11 * 0x1f;
    }
    else if (SVar1 == STYLE_Strife) {
      iVar5 = uVar11 * 0x23 + -4;
    }
    else {
      iVar5 = uVar11 * 0x1f + 2;
    }
    pFVar7 = FImageCollection::operator[]
                       (&statusBar->Images,
                        (statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 6);
    iVar9 = -(uint)(SVar1 == STYLE_HexenStrict);
    if (this->vertical != false) {
      iVar9 = iVar5;
      iVar5 = -(uint)(SVar1 == STYLE_HexenStrict);
    }
    DSBarInfo::DrawGraphic
              (statusBar,pFVar7,(SBarInfoCoordinate)(iVar5 * 2 + (int)this->x),
               (SBarInfoCoordinate)(iVar9 * 2 + (int)this->y),block->xOffset,block->yOffset,
               block->currentAlpha,block->fullScreenOffsets,false,false,0,false,-1);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			int spacing = GetCounterSpacing(statusBar);
		
			double bgalpha = block->Alpha();
			if(translucent)
				bgalpha *= HX_SHADOW;
		
			AInventory *item;
			unsigned int i = 0;
			// If the player has no artifacts, don't draw the bar
			statusBar->CPlayer->mo->InvFirst = statusBar->ValidateInvFirst(size);
			if(statusBar->CPlayer->mo->InvFirst != NULL || alwaysShow)
			{
				for(item = statusBar->CPlayer->mo->InvFirst, i = 0; item != NULL && i < size; item = item->NextInv(), ++i)
				{
					SBarInfoCoordinate rx = x + (!vertical ? i*spacing : 0);
					SBarInfoCoordinate ry = y + (vertical ? i*spacing : 0);
					if(!noArtibox)
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], rx, ry, block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
					if(style != STYLE_Strife) //Strife draws the cursor before the icons
						statusBar->DrawGraphic(TexMan(item->Icon), rx - (style == STYLE_HexenStrict ? 2 : 0), ry - (style == STYLE_HexenStrict ? 1 : 0), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(item == statusBar->CPlayer->mo->InvSel)
					{
						if(style == STYLE_Heretic)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry+29, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Hexen)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_HexenStrict)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx-1, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Strife)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], rx-6, ry-2, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
					}
					if(style == STYLE_Strife)
						statusBar->DrawGraphic(TexMan(item->Icon), rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(counters != NULL && (alwaysShowCounter || item->Amount != 1))
					{
						counters[i]->valueArgument = item->Amount;
						counters[i]->Draw(block, statusBar);
					}
				}
				for (; i < size && !noArtibox; ++i)
					statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], x + (!vertical ? (i*spacing) : 0), y + (vertical ? (i*spacing) : 0), block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
				// Is there something to the left?
				if (!noArrows && statusBar->CPlayer->mo->FirstInv() != statusBar->CPlayer->mo->InvFirst)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? -12 : -10) : 14);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVLFGEM1 : statusBar->invBarOffset + imgINVLFGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
				// Is there something to the right?
				if (!noArrows && item != NULL)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? size*31+2 : size*31) : size*35-4);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVRTGEM1 : statusBar->invBarOffset + imgINVRTGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
			}
		}